

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O0

int IDAInit(void *ida_mem,IDAResFn res,sunrealtype t0,N_Vector yy0,N_Vector yp0)

{
  int iVar1;
  uint uVar2;
  IDAMem IDA_mem_00;
  long in_RCX;
  N_Vector in_RDX;
  IDAResFn in_RSI;
  IDAMem in_RDI;
  sunrealtype in_XMM0_Qa;
  SUNNonlinearSolver NLS;
  sunindextype liw1;
  sunindextype lrw1;
  int allocOK;
  int nvectorOK;
  IDAMem IDA_mem;
  int retval;
  N_Vector in_stack_ffffffffffffffa0;
  IDAMem in_stack_ffffffffffffffa8;
  N_Vector in_stack_ffffffffffffffb0;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x181,"IDAInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RDX == (N_Vector)0x0) {
    IDAProcessError(in_RDI,-0x16,0x18c,"IDAInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,"y0 = NULL illegal.");
    local_4 = -0x16;
  }
  else if (in_RCX == 0) {
    IDAProcessError(in_RDI,-0x16,0x194,"IDAInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,"yp0 = NULL illegal.");
    local_4 = -0x16;
  }
  else if (in_RSI == (IDAResFn)0x0) {
    IDAProcessError(in_RDI,-0x16,0x19c,"IDAInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,"res = NULL illegal.");
    local_4 = -0x16;
  }
  else {
    iVar1 = IDACheckNvector(in_RDX);
    if (iVar1 == 0) {
      IDAProcessError(in_RDI,-0x16,0x1a7,"IDAInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                      ,"A required vector operation is not implemented.");
      local_4 = -0x16;
    }
    else {
      if (in_RDX->ops->nvspace == (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
        in_stack_ffffffffffffffb0 = (N_Vector)0x0;
        in_stack_ffffffffffffffa8 = (IDAMem)0x0;
      }
      else {
        N_VSpace(in_RDX,&stack0xffffffffffffffb0,&stack0xffffffffffffffa8);
      }
      in_RDI->ida_lrw1 = (sunindextype)in_stack_ffffffffffffffb0;
      in_RDI->ida_liw1 = (sunindextype)in_stack_ffffffffffffffa8;
      iVar1 = IDAAllocVectors(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      if (iVar1 == 0) {
        IDAProcessError(in_RDI,-0x15,0x1bd,"IDAInit",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                        ,"A memory request failed.");
        local_4 = -0x15;
      }
      else {
        in_RDI->ida_res = in_RSI;
        in_RDI->ida_tn = in_XMM0_Qa;
        N_VScale(0x3ff0000000000000,in_RDX,in_RDI->ida_phi[0]);
        N_VScale(0x3ff0000000000000,in_RCX,in_RDI->ida_phi[1]);
        IDA_mem_00 = (IDAMem)SUNNonlinSol_Newton(in_stack_ffffffffffffffb0,
                                                 (SUNContext_conflict)in_stack_ffffffffffffffa8);
        if (IDA_mem_00 == (IDAMem)0x0) {
          IDAProcessError(in_RDI,-0x15,0x1d3,"IDAInit",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                          ,"A memory request failed.");
          IDAFreeVectors(IDA_mem_00);
          local_4 = -0x15;
        }
        else {
          uVar2 = IDASetNonlinearSolver(in_stack_ffffffffffffffa8,(SUNNonlinearSolver)IDA_mem_00);
          if (uVar2 == 0) {
            in_RDI->ownNLS = 1;
            in_RDI->ida_linit = (_func_int_IDAMemRec_ptr *)0x0;
            in_RDI->ida_lsetup =
                 (_func_int_IDAMemRec_ptr_N_Vector_N_Vector_N_Vector_N_Vector_N_Vector_N_Vector *)
                 0x0;
            in_RDI->ida_lsolve =
                 (_func_int_IDAMemRec_ptr_N_Vector_N_Vector_N_Vector_N_Vector_N_Vector *)0x0;
            in_RDI->ida_lperf = (_func_int_IDAMemRec_ptr_int *)0x0;
            in_RDI->ida_lfree = (_func_int_IDAMemRec_ptr *)0x0;
            in_RDI->ida_lmem = (void *)0x0;
            in_RDI->ida_nst = 0;
            in_RDI->ida_nre = 0;
            in_RDI->ida_ncfn = 0;
            in_RDI->ida_netf = 0;
            in_RDI->ida_nni = 0;
            in_RDI->ida_nnf = 0;
            in_RDI->ida_nsetups = 0;
            in_RDI->ida_kused = 0;
            in_RDI->ida_hused = 0.0;
            in_RDI->ida_tolsf = 1.0;
            in_RDI->ida_nge = 0;
            in_RDI->ida_irfnd = 0;
            in_RDI->ida_nbacktr = 0;
            in_RDI->ida_glo = (sunrealtype *)0x0;
            in_RDI->ida_ghi = (sunrealtype *)0x0;
            in_RDI->ida_grout = (sunrealtype *)0x0;
            in_RDI->ida_iroots = (int *)0x0;
            in_RDI->ida_rootdir = (int *)0x0;
            in_RDI->ida_gfun = (IDARootFn)0x0;
            in_RDI->ida_nrtfn = 0;
            in_RDI->ida_gactive = (int *)0x0;
            in_RDI->ida_mxgnull = 1;
            in_RDI->ida_SetupDone = 0;
            in_RDI->ida_MallocDone = 1;
            local_4 = 0;
          }
          else {
            IDAProcessError(in_RDI,(int)(ulong)uVar2,0x1e0,"IDAInit",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                            ,"Setting the nonlinear solver failed");
            IDAFreeVectors(IDA_mem_00);
            SUNNonlinSolFree(IDA_mem_00);
            local_4 = -0x15;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int IDAInit(void* ida_mem, IDAResFn res, sunrealtype t0, N_Vector yy0,
            N_Vector yp0)
{
  int retval;
  IDAMem IDA_mem;
  sunbooleantype nvectorOK, allocOK;
  sunindextype lrw1, liw1;
  SUNNonlinearSolver NLS;

  /* Check ida_mem */

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  /* Check for legal input parameters */

  if (yy0 == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_Y0_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  if (yp0 == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_YP0_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  if (res == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_RES_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Test if all required vector operations are implemented */

  nvectorOK = IDACheckNvector(yy0);
  if (!nvectorOK)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_NVECTOR);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Set space requirements for one N_Vector */

  if (yy0->ops->nvspace != NULL) { N_VSpace(yy0, &lrw1, &liw1); }
  else
  {
    lrw1 = 0;
    liw1 = 0;
  }
  IDA_mem->ida_lrw1 = lrw1;
  IDA_mem->ida_liw1 = liw1;

  /* Allocate the vectors (using yy0 as a template) */

  allocOK = IDAAllocVectors(IDA_mem, yy0);
  if (!allocOK)
  {
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  /* Input checks complete at this point and history array allocated */

  /* Copy the input parameters into IDA memory block */
  IDA_mem->ida_res = res;
  IDA_mem->ida_tn  = t0;

  /* Initialize the phi array */
  N_VScale(ONE, yy0, IDA_mem->ida_phi[0]);
  N_VScale(ONE, yp0, IDA_mem->ida_phi[1]);

  /* create a Newton nonlinear solver object by default */
  NLS = SUNNonlinSol_Newton(yy0, IDA_mem->ida_sunctx);

  /* check that nonlinear solver is non-NULL */
  if (NLS == NULL)
  {
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    IDAFreeVectors(IDA_mem);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  /* attach the nonlinear solver to the IDA memory */
  retval = IDASetNonlinearSolver(IDA_mem, NLS);

  /* check that the nonlinear solver was successfully attached */
  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, retval, __LINE__, __func__, __FILE__,
                    "Setting the nonlinear solver failed");
    IDAFreeVectors(IDA_mem);
    SUNNonlinSolFree(NLS);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  /* set ownership flag */
  IDA_mem->ownNLS = SUNTRUE;

  /* All error checking is complete at this point */

  /* Set the linear solver addresses to NULL */

  IDA_mem->ida_linit  = NULL;
  IDA_mem->ida_lsetup = NULL;
  IDA_mem->ida_lsolve = NULL;
  IDA_mem->ida_lperf  = NULL;
  IDA_mem->ida_lfree  = NULL;
  IDA_mem->ida_lmem   = NULL;

  /* Initialize all the counters and other optional output values */

  IDA_mem->ida_nst     = 0;
  IDA_mem->ida_nre     = 0;
  IDA_mem->ida_ncfn    = 0;
  IDA_mem->ida_netf    = 0;
  IDA_mem->ida_nni     = 0;
  IDA_mem->ida_nnf     = 0;
  IDA_mem->ida_nsetups = 0;

  IDA_mem->ida_kused = 0;
  IDA_mem->ida_hused = ZERO;
  IDA_mem->ida_tolsf = ONE;

  IDA_mem->ida_nge = 0;

  IDA_mem->ida_irfnd = 0;

  /* Initialize counters specific to IC calculation. */
  IDA_mem->ida_nbacktr = 0;

  /* Initialize root-finding variables */

  IDA_mem->ida_glo     = NULL;
  IDA_mem->ida_ghi     = NULL;
  IDA_mem->ida_grout   = NULL;
  IDA_mem->ida_iroots  = NULL;
  IDA_mem->ida_rootdir = NULL;
  IDA_mem->ida_gfun    = NULL;
  IDA_mem->ida_nrtfn   = 0;
  IDA_mem->ida_gactive = NULL;
  IDA_mem->ida_mxgnull = 1;

  /* Initial setup not done yet */

  IDA_mem->ida_SetupDone = SUNFALSE;

  /* Problem memory has been successfully allocated */

  IDA_mem->ida_MallocDone = SUNTRUE;

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}